

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O0

void __thiscall
NNTreeIterator::insertAfter(NNTreeIterator *this,QPDFObjectHandle *key,QPDFObjectHandle *value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  NNTreeImpl *this_01;
  QPDF *pQVar1;
  bool bVar2;
  int iVar3;
  iterator parent;
  QPDFObjectHandle local_148;
  _List_node_base *local_138;
  QPDFObjectHandle local_130;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  undefined1 local_d0 [8];
  QPDFObjectHandle items;
  QPDFObjectHandle local_a0;
  QPDFObjectHandle local_90;
  iterator local_80;
  QPDFObjectHandle *local_20;
  QPDFObjectHandle *value_local;
  QPDFObjectHandle *key_local;
  NNTreeIterator *this_local;
  
  local_20 = value;
  value_local = key;
  key_local = (QPDFObjectHandle *)this;
  bVar2 = valid(this);
  if (bVar2) {
    (*(code *)**(undefined8 **)this->impl->details)();
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_d0,(string *)&this->node);
    bVar2 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_d0);
    if (!bVar2) {
      pQVar1 = this->impl->qpdf;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"node contains no items array",&local_f1);
      ::error(pQVar1,&this->node,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator(&local_f1);
    }
    iVar3 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_d0);
    if (iVar3 < this->item_number + 2) {
      pQVar1 = this->impl->qpdf;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"insert: items array is too short",&local_119);
      ::error(pQVar1,&this->node,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator(&local_119);
    }
    QPDFObjectHandle::insertItem((QPDFObjectHandle *)local_d0,this->item_number + 2,key);
    QPDFObjectHandle::insertItem((QPDFObjectHandle *)local_d0,this->item_number + 3,value);
    QPDFObjectHandle::QPDFObjectHandle(&local_130,&this->node);
    local_138 = (_List_node_base *)lastPathElement(this);
    resetLimits(this,&local_130,(iterator)local_138);
    QPDFObjectHandle::~QPDFObjectHandle(&local_130);
    QPDFObjectHandle::QPDFObjectHandle(&local_148,&this->node);
    parent = lastPathElement(this);
    split(this,&local_148,parent);
    QPDFObjectHandle::~QPDFObjectHandle(&local_148);
    increment(this,false);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_d0);
  }
  else {
    QTC::TC("qpdf","NNTree insertAfter inserts first",0);
    this_01 = this->impl;
    QPDFObjectHandle::QPDFObjectHandle(&local_90,key);
    QPDFObjectHandle::QPDFObjectHandle(&local_a0,value);
    NNTreeImpl::insertFirst(&local_80,this_01,&local_90,&local_a0);
    ~NNTreeIterator(&local_80);
    QPDFObjectHandle::~QPDFObjectHandle(&local_a0);
    QPDFObjectHandle::~QPDFObjectHandle(&local_90);
    this_00 = &items.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount;
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this_00,&this->impl->oh);
    deepen(this,(QPDFObjectHandle *)this_00,true,false);
    QPDFObjectHandle::~QPDFObjectHandle
              ((QPDFObjectHandle *)
               &items.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return;
}

Assistant:

void
NNTreeIterator::insertAfter(QPDFObjectHandle key, QPDFObjectHandle value)
{
    if (!valid()) {
        QTC::TC("qpdf", "NNTree insertAfter inserts first");
        impl.insertFirst(key, value);
        deepen(impl.oh, true, false);
        return;
    }

    auto items = this->node.getKey(impl.details.itemsKey());
    if (!items.isArray()) {
        error(impl.qpdf, node, "node contains no items array");
    }
    if (items.getArrayNItems() < this->item_number + 2) {
        error(impl.qpdf, node, "insert: items array is too short");
    }
    items.insertItem(this->item_number + 2, key);
    items.insertItem(this->item_number + 3, value);
    resetLimits(this->node, lastPathElement());
    split(this->node, lastPathElement());
    increment(false);
}